

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O3

ssize_t __thiscall DomFont::write(DomFont *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  char16_t *pcVar2;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar3;
  long in_FS_OFFSET;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  QAnyStringView QVar7;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QAnyStringView QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  QAnyStringView QVar28;
  QString local_40;
  long local_28;
  
  aVar3._4_4_ = in_register_00000034;
  aVar3._0_4_ = __fd;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)((long)__buf + 0x10) == 0) {
    local_40.d.d = (Data *)0x0;
    local_40.d.ptr = L"font";
    local_40.d.size = 4;
  }
  else {
    QString::toLower_helper(&local_40);
  }
  QVar16.m_size = (size_t)local_40.d.ptr;
  QVar16.field_0.m_data = aVar3.m_data;
  QXmlStreamWriter::writeStartElement(QVar16);
  if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
    }
  }
  uVar1 = this->m_children;
  if ((uVar1 & 1) != 0) {
    QVar4.m_size = (size_t)(this->m_family).d.ptr;
    QVar4.field_0.m_data = (void *)0x8000000000000006;
    QVar17.m_size = (size_t)L"family";
    QVar17.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeTextElement(QVar17,QVar4);
    uVar1 = this->m_children;
  }
  if ((uVar1 & 2) != 0) {
    QString::number((int)&local_40,this->m_pointSize);
    QVar5.m_size = (size_t)local_40.d.ptr;
    QVar5.field_0.m_data = (void *)0x8000000000000009;
    QVar18.m_size = (size_t)L"pointsize";
    QVar18.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeTextElement(QVar18,QVar5);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar1 = this->m_children;
  }
  if ((uVar1 & 4) != 0) {
    QString::number((int)&local_40,this->m_weight);
    QVar6.m_size = (size_t)local_40.d.ptr;
    QVar6.field_0.m_data = (void *)0x8000000000000006;
    QVar19.m_size = (size_t)L"weight";
    QVar19.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeTextElement(QVar19,QVar6);
    if (&(local_40.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_40.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_40.d.d)->super_QArrayData,2,0x10);
      }
    }
    uVar1 = this->m_children;
  }
  if ((uVar1 & 8) != 0) {
    pcVar2 = L"false";
    if (this->m_italic != false) {
      pcVar2 = L"true";
    }
    QVar7.m_size = (size_t)pcVar2;
    QVar7.field_0.m_data = (void *)0x8000000000000006;
    QVar20.m_size = (size_t)L"italic";
    QVar20.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeTextElement(QVar20,QVar7);
    uVar1 = this->m_children;
  }
  if ((uVar1 & 0x10) != 0) {
    pcVar2 = L"false";
    if (this->m_bold != false) {
      pcVar2 = L"true";
    }
    QVar8.m_size = (size_t)pcVar2;
    QVar8.field_0.m_data = (void *)0x8000000000000004;
    QVar21.m_size = (size_t)L"bold";
    QVar21.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeTextElement(QVar21,QVar8);
    uVar1 = this->m_children;
  }
  if ((uVar1 & 0x20) != 0) {
    pcVar2 = L"false";
    if (this->m_underline != false) {
      pcVar2 = L"true";
    }
    QVar9.m_size = (size_t)pcVar2;
    QVar9.field_0.m_data = (void *)0x8000000000000009;
    QVar22.m_size = (size_t)L"underline";
    QVar22.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeTextElement(QVar22,QVar9);
    uVar1 = this->m_children;
  }
  if ((uVar1 & 0x40) != 0) {
    pcVar2 = L"false";
    if (this->m_strikeOut != false) {
      pcVar2 = L"true";
    }
    QVar10.m_size = (size_t)pcVar2;
    QVar10.field_0.m_data = (void *)0x8000000000000009;
    QVar23.m_size = (size_t)L"strikeout";
    QVar23.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeTextElement(QVar23,QVar10);
    uVar1 = this->m_children;
  }
  if ((char)uVar1 < '\0') {
    pcVar2 = L"false";
    if (this->m_antialiasing != false) {
      pcVar2 = L"true";
    }
    QVar11.m_size = (size_t)pcVar2;
    QVar11.field_0.m_data = (void *)0x800000000000000c;
    QVar24.m_size = (size_t)L"antialiasing";
    QVar24.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeTextElement(QVar24,QVar11);
    uVar1 = this->m_children;
  }
  if ((uVar1 >> 8 & 1) != 0) {
    QVar12.m_size = (size_t)(this->m_styleStrategy).d.ptr;
    QVar12.field_0.m_data = (void *)0x800000000000000d;
    QVar25.m_size = (size_t)L"stylestrategy";
    QVar25.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeTextElement(QVar25,QVar12);
    uVar1 = this->m_children;
  }
  if ((uVar1 >> 9 & 1) != 0) {
    pcVar2 = L"false";
    if (this->m_kerning != false) {
      pcVar2 = L"true";
    }
    QVar13.m_size = (size_t)pcVar2;
    QVar13.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)(void *)0x8000000000000007;
    QVar26.m_size = (size_t)L"kerning";
    QVar26.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeTextElement(QVar26,QVar13);
    uVar1 = this->m_children;
  }
  if ((uVar1 >> 10 & 1) != 0) {
    QVar14.m_size = (size_t)(this->m_hintingPreference).d.ptr;
    QVar14.field_0.m_data = (void *)0x8000000000000011;
    QVar27.m_size = (size_t)L"hintingpreference";
    QVar27.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeTextElement(QVar27,QVar14);
    uVar1 = this->m_children;
  }
  if ((uVar1 >> 0xb & 1) != 0) {
    QVar15.m_size = (size_t)(this->m_fontWeight).d.ptr;
    QVar15.field_0.m_data = (void *)0x800000000000000a;
    QVar28.m_size = (size_t)L"fontweight";
    QVar28.field_0.m_data = aVar3.m_data;
    QXmlStreamWriter::writeTextElement(QVar28,QVar15);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomFont::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("font") : tagName.toLower());

    if (m_children & Family)
        writer.writeTextElement(u"family"_s, m_family);

    if (m_children & PointSize)
        writer.writeTextElement(u"pointsize"_s, QString::number(m_pointSize));

    if (m_children & Weight)
        writer.writeTextElement(u"weight"_s, QString::number(m_weight));

    if (m_children & Italic)
        writer.writeTextElement(u"italic"_s, (m_italic ? u"true"_s : u"false"_s));

    if (m_children & Bold)
        writer.writeTextElement(u"bold"_s, (m_bold ? u"true"_s : u"false"_s));

    if (m_children & Underline)
        writer.writeTextElement(u"underline"_s, (m_underline ? u"true"_s : u"false"_s));

    if (m_children & StrikeOut)
        writer.writeTextElement(u"strikeout"_s, (m_strikeOut ? u"true"_s : u"false"_s));

    if (m_children & Antialiasing)
        writer.writeTextElement(u"antialiasing"_s, (m_antialiasing ? u"true"_s : u"false"_s));

    if (m_children & StyleStrategy)
        writer.writeTextElement(u"stylestrategy"_s, m_styleStrategy);

    if (m_children & Kerning)
        writer.writeTextElement(u"kerning"_s, (m_kerning ? u"true"_s : u"false"_s));

    if (m_children & HintingPreference)
        writer.writeTextElement(u"hintingpreference"_s, m_hintingPreference);

    if (m_children & FontWeight)
        writer.writeTextElement(u"fontweight"_s, m_fontWeight);

    writer.writeEndElement();
}